

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynNamespaceDefinition * ParseNamespaceDefinition(ParseContext *ctx)

{
  uint uVar1;
  LexemeType LVar2;
  char *pcVar3;
  SynNamespaceElement *pSVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SynNamespaceDefinition *this;
  Lexeme *pLVar8;
  Lexeme *pLVar9;
  IntrusiveList<SynBase> IVar10;
  IntrusiveList<SynIdentifier> path;
  IntrusiveList<SynIdentifier> local_68;
  Lexeme *local_50;
  SynIdentifier *local_48;
  SynIdentifier *pSStack_40;
  SynIdentifier *pSVar7;
  undefined4 extraout_var_01;
  
  pLVar9 = ctx->currentLexeme;
  if (pLVar9->type == lex_namespace) {
    ctx->currentLexeme = pLVar9 + 1;
    local_68.head = (SynIdentifier *)0x0;
    local_68.tail = (SynIdentifier *)0x0;
    bVar5 = anon_unknown.dwarf_15703::CheckAt(ctx,lex_string,"ERROR: namespace name required");
    if (bVar5) {
      pLVar8 = ctx->currentLexeme;
      pcVar3 = pLVar8->pos;
      uVar1 = pLVar8->length;
      if (pLVar8->type != lex_none) {
        ctx->currentLexeme = pLVar8 + 1;
      }
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar7 = (SynIdentifier *)CONCAT44(extraout_var,iVar6);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00118f54;
      pLVar8 = ctx->currentLexeme + -1;
      SynBase::SynBase((SynBase *)pSVar7,4,pLVar8,pLVar8);
      (pSVar7->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
      (pSVar7->name).begin = pcVar3;
      (pSVar7->name).end = pcVar3 + uVar1;
      IntrusiveList<SynIdentifier>::push_back(&local_68,pSVar7);
    }
    pLVar8 = ctx->currentLexeme;
    LVar2 = pLVar8->type;
    local_50 = pLVar9;
    while (LVar2 == lex_point) {
      ctx->currentLexeme = pLVar8 + 1;
      bVar5 = anon_unknown.dwarf_15703::CheckAt
                        (ctx,lex_string,"ERROR: namespace name required after \'.\'");
      if (!bVar5) break;
      pLVar9 = ctx->currentLexeme;
      pcVar3 = pLVar9->pos;
      uVar1 = pLVar9->length;
      if (pLVar9->type != lex_none) {
        ctx->currentLexeme = pLVar9 + 1;
      }
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar7 = (SynIdentifier *)CONCAT44(extraout_var_00,iVar6);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00118f54;
      pLVar9 = ctx->currentLexeme + -1;
      SynBase::SynBase((SynBase *)pSVar7,4,pLVar9,pLVar9);
      (pSVar7->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
      (pSVar7->name).begin = pcVar3;
      (pSVar7->name).end = pcVar3 + uVar1;
      IntrusiveList<SynIdentifier>::push_back(&local_68,pSVar7);
      pLVar8 = ctx->currentLexeme;
      LVar2 = pLVar8->type;
    }
    anon_unknown.dwarf_15703::CheckConsume
              (ctx,lex_ofigure,"ERROR: \'{\' not found after namespace name");
    pSVar4 = ctx->currentNamespace;
    for (pSVar7 = local_68.head; pSVar7 != (SynIdentifier *)0x0;
        pSVar7 = (SynIdentifier *)(pSVar7->super_SynBase).next) {
      ParseContext::PushNamespace(ctx,pSVar7);
    }
    IVar10 = ParseExpressions(ctx);
    ctx->currentNamespace = pSVar4;
    anon_unknown.dwarf_15703::CheckConsume
              (ctx,lex_cfigure,"ERROR: \'}\' not found after namespace body");
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    this = (SynNamespaceDefinition *)CONCAT44(extraout_var_01,iVar6);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_00118f54:
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    local_48 = local_68.head;
    pSStack_40 = local_68.tail;
    SynBase::SynBase((SynBase *)this,0x41,local_50,ctx->currentLexeme + -1);
    (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00247990;
    (this->path).head = local_48;
    (this->path).tail = pSStack_40;
    this->expressions = IVar10;
  }
  else {
    this = (SynNamespaceDefinition *)0x0;
  }
  return this;
}

Assistant:

SynNamespaceDefinition* ParseNamespaceDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_namespace))
	{
		IntrusiveList<SynIdentifier> path;

		if(CheckAt(ctx, lex_string, "ERROR: namespace name required"))
		{
			InplaceStr value = ctx.Consume();
			path.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), value));
		}

		while(ctx.Consume(lex_point))
		{
			if(!CheckAt(ctx, lex_string, "ERROR: namespace name required after '.'"))
				break;

			InplaceStr value = ctx.Consume();
			path.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), value));
		}

		CheckConsume(ctx, lex_ofigure, "ERROR: '{' not found after namespace name");

		SynNamespaceElement *currentNamespace = ctx.currentNamespace;

		for(SynIdentifier *el = path.head; el; el = (SynIdentifier*)el->next)
			ctx.PushNamespace(el);

		IntrusiveList<SynBase> code = ParseExpressions(ctx);

		ctx.currentNamespace = currentNamespace;

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after namespace body");

		return new (ctx.get<SynNamespaceDefinition>()) SynNamespaceDefinition(start, ctx.Previous(), path, code);
	}

	return NULL;
}